

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  vec<unsigned_int,_int> *pvVar11;
  int i;
  int local_34;
  int iVar6;
  
  if (this->n_touched != 0) {
    iVar4 = (this->subsumption_queue).end;
    iVar7 = (this->subsumption_queue).buf.sz;
    iVar9 = (this->subsumption_queue).first;
    iVar10 = 0;
    iVar6 = 0;
    if (iVar4 < iVar9) {
      iVar6 = iVar7;
    }
    iVar5 = iVar6 + (iVar4 - iVar9);
    if (iVar5 != 0 && SCARRY4(iVar6,iVar4 - iVar9) == iVar5 < 0) {
      do {
        puVar3 = (this->super_Solver).ca.ra.memory;
        uVar1 = (this->subsumption_queue).buf.data[(iVar9 + iVar10) % iVar7];
        uVar2 = puVar3[uVar1];
        if ((uVar2 & 3) == 0) {
          puVar3[uVar1] = uVar2 | 2;
          iVar4 = (this->subsumption_queue).end;
          iVar7 = (this->subsumption_queue).buf.sz;
          iVar9 = (this->subsumption_queue).first;
        }
        iVar10 = iVar10 + 1;
        iVar6 = 0;
        if (iVar4 < iVar9) {
          iVar6 = iVar7;
        }
      } while (iVar10 < (iVar4 - iVar9) + iVar6);
    }
    local_34 = 0;
    iVar6 = (this->super_Solver).next_var;
    if (0 < iVar6) {
      do {
        lVar8 = (long)local_34;
        if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[lVar8]
            != '\0') {
          if ((this->occurs).dirty.map.data[lVar8] != '\0') {
            OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
            ::clean(&this->occurs,&local_34);
            lVar8 = (long)local_34;
          }
          pvVar11 = (this->occurs).occs.map.data;
          iVar4 = pvVar11[lVar8].sz;
          if (0 < iVar4) {
            pvVar11 = pvVar11 + lVar8;
            lVar8 = 0;
            do {
              if (((this->super_Solver).ca.ra.memory[pvVar11->data[lVar8]] & 3) == 0) {
                Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar11->data[lVar8]);
                puVar3 = (this->super_Solver).ca.ra.memory;
                puVar3[pvVar11->data[lVar8]] = puVar3[pvVar11->data[lVar8]] & 0xfffffffc | 2;
                iVar4 = pvVar11->sz;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar4);
          }
          (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[local_34]
               = '\0';
          iVar6 = (this->super_Solver).next_var;
        }
        local_34 = local_34 + 1;
      } while (local_34 < iVar6);
      iVar4 = (this->subsumption_queue).end;
      iVar7 = (this->subsumption_queue).buf.sz;
      iVar9 = (this->subsumption_queue).first;
    }
    iVar10 = 0;
    iVar6 = 0;
    if (iVar4 < iVar9) {
      iVar6 = iVar7;
    }
    iVar5 = iVar6 + (iVar4 - iVar9);
    if (iVar5 != 0 && SCARRY4(iVar6,iVar4 - iVar9) == iVar5 < 0) {
      do {
        puVar3 = (this->super_Solver).ca.ra.memory;
        uVar1 = (this->subsumption_queue).buf.data[(iVar9 + iVar10) % iVar7];
        uVar2 = puVar3[uVar1];
        if ((uVar2 & 3) == 2) {
          puVar3[uVar1] = uVar2 & 0xfffffffc;
          iVar4 = (this->subsumption_queue).end;
          iVar7 = (this->subsumption_queue).buf.sz;
          iVar9 = (this->subsumption_queue).first;
        }
        iVar10 = iVar10 + 1;
        iVar6 = 0;
        if (iVar4 < iVar9) {
          iVar6 = iVar7;
        }
      } while (iVar10 < (iVar4 - iVar9) + iVar6);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < nVars(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}